

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void * __thiscall
google::protobuf::Reflection::RepeatedFieldData
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpp_type,
          Descriptor *message_type)

{
  FieldDescriptor field_type;
  uint uVar1;
  int number;
  bool packed;
  uint32 uVar2;
  LogMessage *pLVar3;
  Descriptor *pDVar4;
  void *pvVar5;
  FieldDescriptor *local_b8;
  Reflection *local_b0;
  FieldDescriptor *local_a8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_b0 = this;
  if (*(int *)(field + 0x3c) != 3) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x892);
    pLVar3 = internal::LogMessage::operator<<(&local_68,"CHECK failed: field->is_repeated(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar3);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_a0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_b8 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_a0,&local_b8)
    ;
  }
  if (*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) !=
      cpp_type) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_a0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_b8 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_a0,
                 &local_b8);
    }
    if ((cpp_type != CPPTYPE_INT32) ||
       (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 8)) {
      internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x895);
      pLVar3 = internal::LogMessage::operator<<
                         (&local_a0,
                          "CHECK failed: field->cpp_type() == cpp_type || (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM && cpp_type == FieldDescriptor::CPPTYPE_INT32): "
                         );
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,"The type parameter T in RepeatedFieldRef<T> API doesn\'t match ");
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,"the actual field type (for enums T should be the generated enum ")
      ;
      pLVar3 = internal::LogMessage::operator<<(pLVar3,"type or int32).");
      internal::LogFinisher::operator=((LogFinisher *)&local_a8,pLVar3);
      internal::LogMessage::~LogMessage(&local_a0);
    }
  }
  if ((message_type != (Descriptor *)0x0) &&
     (pDVar4 = FieldDescriptor::message_type(field), pDVar4 != message_type)) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x89a);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_a0,"CHECK failed: (message_type) == (field->message_type()): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_b8,pLVar3);
    internal::LogMessage::~LogMessage(&local_a0);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    uVar1 = (local_b0->schema_).extensions_offset_;
    number = *(int *)(field + 0x44);
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_b8 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
      local_a8 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_b8,
                 &local_a8);
    }
    field_type = field[0x38];
    packed = FieldDescriptor::is_packed(field);
    pvVar5 = internal::ExtensionSet::MutableRawRepeatedField
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),
                        number,(FieldType)field_type,packed,field);
  }
  else {
    uVar2 = internal::ReflectionSchema::GetFieldOffsetNonOneof(&local_b0->schema_,field);
    pvVar5 = (void *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
  }
  return pvVar5;
}

Assistant:

void* Reflection::RepeatedFieldData(Message* message,
                                    const FieldDescriptor* field,
                                    FieldDescriptor::CppType cpp_type,
                                    const Descriptor* message_type) const {
  GOOGLE_CHECK(field->is_repeated());
  GOOGLE_CHECK(field->cpp_type() == cpp_type ||
        (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
         cpp_type == FieldDescriptor::CPPTYPE_INT32))
      << "The type parameter T in RepeatedFieldRef<T> API doesn't match "
      << "the actual field type (for enums T should be the generated enum "
      << "type or int32).";
  if (message_type != nullptr) {
    GOOGLE_CHECK_EQ(message_type, field->message_type());
  }
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    return MutableRawNonOneof<char>(message, field);
  }
}